

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O1

void __thiscall
DSectorScrollInterpolation::DSectorScrollInterpolation
          (DSectorScrollInterpolation *this,sector_t_conflict *_sector,bool _plane)

{
  undefined3 in_register_00000011;
  
  DObject::DObject((DObject *)this);
  (this->super_DInterpolation).Next.field_0.p = (DInterpolation *)0x0;
  (this->super_DInterpolation).Prev.field_0.p = (DInterpolation *)0x0;
  (this->super_DInterpolation).refcount = 0;
  (this->super_DInterpolation).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_0070f0a0;
  this->sector = _sector;
  this->ceiling = _plane;
  this->oldx = _sector->planes[CONCAT31(in_register_00000011,_plane)].xform.xOffs;
  this->oldy = _sector->planes[CONCAT31(in_register_00000011,_plane)].xform.yOffs;
  FInterpolator::AddInterpolation(&interpolator,&this->super_DInterpolation);
  return;
}

Assistant:

DSectorScrollInterpolation::DSectorScrollInterpolation(sector_t *_sector, bool _plane)
{
	sector = _sector;
	ceiling = _plane;
	UpdateInterpolation ();
	interpolator.AddInterpolation(this);
}